

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-metrics.c
# Opt level: O0

void write_cb(uv_write_t *req,int status)

{
  FILE *__stream;
  char *pcVar1;
  void *eval_b;
  void *eval_a;
  int status_local;
  uv_write_t *req_local;
  
  __stream = _stderr;
  if (req == (uv_write_t *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-writealot.c"
            ,0x65,"req","!=","NULL",0,"!=",0);
    abort();
  }
  if (status != 0) {
    pcVar1 = uv_strerror(status);
    fprintf(__stream,"uv_write error: %s\n",pcVar1);
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-writealot.c"
            ,0x69,"0");
    abort();
  }
  bytes_sent_done = bytes_sent_done + 0x2728000;
  write_cb_called = write_cb_called + 1;
  return;
}

Assistant:

static void write_cb(uv_fs_t* req) {
  uv_metrics_t metrics;

  ASSERT_OK(uv_metrics_info(uv_default_loop(), &metrics));
  ASSERT_UINT64_EQ(2, metrics.loop_count);
  ASSERT_UINT64_GT(metrics.events, last_events_count);
  ASSERT_EQ(req->result, sizeof(test_buf));

  uv_fs_req_cleanup(req);
  last_events_count = metrics.events;

  ASSERT_OK(uv_fs_close(uv_default_loop(),
                        &fs_reqs.close_req,
                        (uv_os_fd_t) fs_reqs.open_req.result,
                        close_cb));
}